

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad.cpp
# Opt level: O1

void __thiscall
BiquadFilterR<float>::process
          (BiquadFilterR<float> *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pfVar7 = src.mData;
  fVar8 = this->mZ1;
  fVar9 = this->mZ2;
  if (pfVar7 != src.mDataEnd) {
    fVar1 = this->mB0;
    fVar2 = this->mB1;
    fVar3 = this->mB2;
    fVar4 = this->mA1;
    fVar5 = this->mA2;
    do {
      fVar6 = *pfVar7;
      fVar10 = fVar6 * fVar1 + fVar8;
      fVar8 = (fVar6 * fVar2 - fVar4 * fVar10) + fVar9;
      fVar9 = fVar6 * fVar3 - fVar5 * fVar10;
      *dst = fVar10;
      pfVar7 = pfVar7 + 1;
      dst = dst + 1;
    } while (pfVar7 != src.mDataEnd);
  }
  this->mZ1 = fVar8;
  this->mZ2 = fVar9;
  return;
}

Assistant:

void BiquadFilterR<Real>::process(const al::span<const Real> src, Real *dst)
{
    const Real b0{mB0};
    const Real b1{mB1};
    const Real b2{mB2};
    const Real a1{mA1};
    const Real a2{mA2};
    Real z1{mZ1};
    Real z2{mZ2};

    /* Processing loop is Transposed Direct Form II. This requires less storage
     * compared to Direct Form I (only two delay components, instead of a four-
     * sample history; the last two inputs and outputs), and works better for
     * floating-point which favors summing similarly-sized values while being
     * less bothered by overflow.
     *
     * See: http://www.earlevel.com/main/2003/02/28/biquads/
     */
    auto proc_sample = [b0,b1,b2,a1,a2,&z1,&z2](Real input) noexcept -> Real
    {
        const Real output{input*b0 + z1};
        z1 = input*b1 - output*a1 + z2;
        z2 = input*b2 - output*a2;
        return output;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);

    mZ1 = z1;
    mZ2 = z2;
}